

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  _data_t local_31;
  Serializer serializer;
  Sample_t<kiste::terminal_t,_Data,_Serializer> sample;
  
  sample._serialize = &serializer;
  serializer.super_raw._os = (ostream *)&std::cout;
  serializer.caughtInt = false;
  serializer.caughtString = false;
  serializer.caughtException = false;
  sample.child = (terminal_t *)&kiste::terminal;
  sample.data = &local_31;
  test::Sample_t<kiste::terminal_t,_Data,_Serializer>::render(&sample);
  if (((serializer.caughtInt != true) || (serializer.caughtString != true)) ||
     (iVar1 = 0, serializer.caughtException == false)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Missed some expected exception! Please inspect")
    ;
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = Serializer{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
  if (not(serializer.caughtInt and serializer.caughtString and serializer.caughtException))
  {
    std::cerr << "Missed some expected exception! Please inspect" << std::endl;
    return 1;
  }
}